

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

diyfp nlohmann::json_abi_v3_11_3::detail::dtoa_impl::diyfp::normalize(diyfp x)

{
  int in_ESI;
  long in_RDI;
  diyfp dVar1;
  long local_28;
  int iStack_20;
  
  local_28 = in_RDI;
  iStack_20 = in_ESI;
  if (in_RDI == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x42a1,"GGML_ASSERT(%s) failed","x.f != 0");
  }
  for (; -1 < local_28; local_28 = local_28 << 1) {
    iStack_20 = iStack_20 + -1;
  }
  dVar1.e = iStack_20;
  dVar1.f = local_28;
  dVar1._12_4_ = 0;
  return dVar1;
}

Assistant:

static diyfp normalize(diyfp x) noexcept
    {
        JSON_ASSERT(x.f != 0);

        while ((x.f >> 63u) == 0)
        {
            x.f <<= 1u;
            x.e--;
        }

        return x;
    }